

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::BlindRawTransactionRequest,cfd::js::api::json::BlindTransactionResponse,cfd::js::api::BlindRawTransactionRequestStruct,cfd::js::api::BlindTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  BlindTransactionResponseStruct response;
  BlindRawTransactionRequestStruct request;
  BlindTransactionResponse res;
  BlindRawTransactionRequest req;
  string local_3a8;
  BlindTransactionResponseStruct local_388;
  BlindRawTransactionRequestStruct local_290;
  ErrorResponse local_1c8;
  BlindRawTransactionRequest local_110;
  
  BlindRawTransactionRequest::BlindRawTransactionRequest(&local_110);
  core::JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>::Deserialize
            (&local_110.super_JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>,
             (string *)this);
  BlindRawTransactionRequest::ConvertToStruct(&local_290,&local_110);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_388,request_message,&local_290);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_388.error.code == 0) {
      BlindTransactionResponse::BlindTransactionResponse((BlindTransactionResponse *)&local_1c8);
      BlindTransactionResponse::ConvertFromStruct((BlindTransactionResponse *)&local_1c8,&local_388)
      ;
      core::JsonClassBase<cfd::js::api::json::BlindTransactionResponse>::Serialize_abi_cxx11_
                (&local_3a8,
                 (JsonClassBase<cfd::js::api::json::BlindTransactionResponse> *)&local_1c8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      BlindTransactionResponse::~BlindTransactionResponse((BlindTransactionResponse *)&local_1c8);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1c8,&local_388.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_3a8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1c8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      local_1c8.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_1c8.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1c8.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_388.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_388.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.error.message._M_dataplus._M_p != &local_388.error.message.field_2) {
      operator_delete(local_388.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.error.type._M_dataplus._M_p != &local_388.error.type.field_2) {
      operator_delete(local_388.error.type._M_dataplus._M_p);
    }
    std::
    vector<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
    ::~vector(&local_388.issuance_blinders);
    std::
    vector<cfd::js::api::UnblindOutputStruct,_std::allocator<cfd::js::api::UnblindOutputStruct>_>::
    ~vector(&local_388.blinders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.hex._M_dataplus._M_p != &local_388.hex.field_2) {
      operator_delete(local_388.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_290.ignore_items._M_t);
    std::
    vector<cfd::js::api::BlindIssuanceRequestStruct,_std::allocator<cfd::js::api::BlindIssuanceRequestStruct>_>
    ::~vector(&local_290.issuances);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290.txout_confidential_addresses);
    std::
    vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
    ::~vector(&local_290.txouts);
    std::
    vector<cfd::js::api::BlindTxInRequestStruct,_std::allocator<cfd::js::api::BlindTxInRequestStruct>_>
    ::~vector(&local_290.txins);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.tx._M_dataplus._M_p != &local_290.tx.field_2) {
      operator_delete(local_290.tx._M_dataplus._M_p);
    }
    BlindRawTransactionRequest::~BlindRawTransactionRequest(&local_110);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  BlindTransactionResponse::~BlindTransactionResponse((BlindTransactionResponse *)&local_1c8);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  BlindTransactionResponseStruct::~BlindTransactionResponseStruct(&local_388);
  BlindRawTransactionRequestStruct::~BlindRawTransactionRequestStruct(&local_290);
  BlindRawTransactionRequest::~BlindRawTransactionRequest(&local_110);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}